

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O1

void __thiscall
PushPopTest_RandomOrder_Test::~PushPopTest_RandomOrder_Test(PushPopTest_RandomOrder_Test *this)

{
  Test *this_00;
  
  this_00 = (Test *)&this[-1].super_PushPopTest.stdDeque.
                     super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                     _M_finish._M_last;
  this[-1].super_PushPopTest.stdDeque.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&PTR__PushPopTest_00162c78;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&DAT_00162cb8;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &(this->super_PushPopTest).myDeque.big_.allocSize_);
  Deque<int,_std::allocator<int>_>::~Deque
            ((Deque<int,_std::allocator<int>_> *)&(this->super_PushPopTest)._A);
  testing::Test::~Test(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

TEST_P(PushPopTest, RandomOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
        stdDeque.push_front(y);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}